

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

OpResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,bool owned,CordRep *edge,size_t delta)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint8_t uVar10;
  CordRepBtree *pCVar11;
  undefined8 uVar12;
  long lVar13;
  OpResult OVar14;
  
  bVar2 = (this->super_CordRep).storage[2];
  bVar3 = (this->super_CordRep).storage[1];
  if ((ulong)bVar2 - (ulong)bVar3 < 6) {
    uVar12 = 0;
    pCVar11 = this;
    if (!owned) {
      sVar4 = (this->super_CordRep).length;
      pCVar11 = (CordRepBtree *)operator_new(0x40);
      (pCVar11->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
      (pCVar11->super_CordRep).length = sVar4;
      uVar12 = *(undefined8 *)((long)this->edges_ + 4);
      uVar6 = *(undefined8 *)((long)this->edges_ + 0xc);
      uVar7 = *(undefined8 *)((long)this->edges_ + 0x14);
      uVar8 = *(undefined8 *)((long)this->edges_ + 0x1c);
      uVar9 = *(undefined8 *)((long)this->edges_ + 0x24);
      *(undefined8 *)&(pCVar11->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
      *(undefined8 *)((long)pCVar11->edges_ + 4) = uVar12;
      *(undefined8 *)((long)pCVar11->edges_ + 0xc) = uVar6;
      *(undefined8 *)((long)pCVar11->edges_ + 0x14) = uVar7;
      *(undefined8 *)((long)pCVar11->edges_ + 0x1c) = uVar8;
      *(undefined8 *)((long)pCVar11->edges_ + 0x24) = uVar9;
      *(undefined4 *)((long)pCVar11->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
      uVar12 = 1;
      if (bVar3 != bVar2) {
        lVar13 = (ulong)bVar3 << 3;
        do {
          lVar5 = *(long *)((long)this->edges_ + lVar13);
          if (lVar5 == 0) {
            __assert_fail("rep != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
          }
          LOCK();
          piVar1 = (int *)(lVar5 + 8);
          *piVar1 = *piVar1 + 2;
          UNLOCK();
          lVar13 = lVar13 + 8;
        } while ((ulong)bVar2 * 8 != lVar13);
      }
    }
    if ((pCVar11->super_CordRep).storage[1] != '\0') {
      AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>();
    }
    bVar2 = (pCVar11->super_CordRep).storage[2];
    (pCVar11->super_CordRep).storage[2] = bVar2 + 1;
    pCVar11->edges_[bVar2] = edge;
    (pCVar11->super_CordRep).length = (pCVar11->super_CordRep).length + delta;
  }
  else {
    pCVar11 = (CordRepBtree *)operator_new(0x40);
    (pCVar11->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    if (edge->tag == '\x03') {
      uVar10 = edge->storage[0] + '\x01';
    }
    else {
      uVar10 = '\0';
    }
    (pCVar11->super_CordRep).length = edge->length;
    (pCVar11->super_CordRep).tag = '\x03';
    (pCVar11->super_CordRep).storage[0] = uVar10;
    (pCVar11->super_CordRep).storage[1] = '\0';
    (pCVar11->super_CordRep).storage[2] = '\x01';
    pCVar11->edges_[0] = edge;
    uVar12 = 2;
  }
  OVar14._8_8_ = uVar12;
  OVar14.tree = pCVar11;
  return OVar14;
}

Assistant:

inline OpResult CordRepBtree::AddEdge(bool owned, CordRep* edge, size_t delta) {
  if (size() >= kMaxCapacity) return {New(edge), kPopped};
  OpResult result = ToOpResult(owned);
  result.tree->Add<edge_type>(edge);
  result.tree->length += delta;
  return result;
}